

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3RefillIndex(Parse *pParse,Index *pIndex,int memRootPage)

{
  sqlite3 *db_00;
  ushort uVar1;
  int iVar2;
  int iVar3;
  Vdbe *p;
  KeyInfo *p_00;
  KeyInfo *zP4;
  int j2;
  int iDb;
  sqlite3 *db;
  int regRecord;
  KeyInfo *pKey;
  Vdbe *v;
  int local_40;
  int iPartIdxLabel;
  int tnum;
  int addr2;
  int addr1;
  int iSorter;
  int iIdx;
  int iTab;
  Table *pTab;
  Index *pIStack_18;
  int memRootPage_local;
  Index *pIndex_local;
  Parse *pParse_local;
  
  _iIdx = pIndex->pTable;
  iSorter = pParse->nTab;
  pParse->nTab = iSorter + 1;
  addr1 = pParse->nTab;
  pParse->nTab = addr1 + 1;
  db_00 = pParse->db;
  pTab._4_4_ = memRootPage;
  pIStack_18 = pIndex;
  pIndex_local = (Index *)pParse;
  iVar2 = sqlite3SchemaToIndex(db_00,pIndex->pSchema);
  iVar3 = sqlite3AuthCheck((Parse *)pIndex_local,0x1b,pIStack_18->zName,(char *)0x0,
                           db_00->aDb[iVar2].zDbSName);
  if (iVar3 == 0) {
    sqlite3TableLock((Parse *)pIndex_local,iVar2,_iIdx->tnum,'\x01',_iIdx->zName);
    p = sqlite3GetVdbe((Parse *)pIndex_local);
    if (p != (Vdbe *)0x0) {
      if (pTab._4_4_ < 0) {
        local_40 = pIStack_18->tnum;
      }
      else {
        local_40 = pTab._4_4_;
      }
      p_00 = sqlite3KeyInfoOfIndex((Parse *)pIndex_local,pIStack_18);
      iVar3 = *(int *)((long)&pIndex_local->pSchema + 4);
      *(int *)((long)&pIndex_local->pSchema + 4) = iVar3 + 1;
      uVar1 = pIStack_18->nKeyCol;
      addr2 = iVar3;
      zP4 = sqlite3KeyInfoRef(p_00);
      sqlite3VdbeAddOp4(p,0x72,iVar3,0,(uint)uVar1,(char *)zP4,-9);
      sqlite3OpenTable((Parse *)pIndex_local,iSorter,iVar2,_iIdx,0x6d);
      tnum = sqlite3VdbeAddOp2(p,0x24,iSorter,0);
      iVar3 = sqlite3GetTempReg((Parse *)pIndex_local);
      sqlite3MultiWrite((Parse *)pIndex_local);
      sqlite3GenerateIndexKey
                ((Parse *)pIndex_local,pIStack_18,iSorter,iVar3,0,(int *)((long)&v + 4),(Index *)0x0
                 ,0);
      sqlite3VdbeAddOp2(p,0x84,addr2,iVar3);
      sqlite3ResolvePartIdxLabel((Parse *)pIndex_local,v._4_4_);
      sqlite3VdbeAddOp2(p,5,iSorter,tnum + 1);
      sqlite3VdbeJumpHere(p,tnum);
      if (pTab._4_4_ < 0) {
        sqlite3VdbeAddOp2(p,0x8a,local_40,iVar2);
      }
      sqlite3VdbeAddOp4(p,0x6e,addr1,local_40,iVar2,(char *)p_00,-9);
      uVar1 = 0;
      if (-1 < pTab._4_4_) {
        uVar1 = 0x10;
      }
      sqlite3VdbeChangeP5(p,uVar1 | 1);
      tnum = sqlite3VdbeAddOp2(p,0x22,addr2,0);
      if (pIStack_18->onError == '\0') {
        iPartIdxLabel = sqlite3VdbeCurrentAddr(p);
      }
      else {
        iVar2 = sqlite3VdbeGoto(p,1);
        iPartIdxLabel = sqlite3VdbeCurrentAddr(p);
        sqlite3VdbeAddOp4Int(p,0x7e,addr2,iVar2,iVar3,(uint)pIStack_18->nKeyCol);
        sqlite3UniqueConstraint((Parse *)pIndex_local,2,pIStack_18);
        sqlite3VdbeJumpHere(p,iVar2);
      }
      sqlite3VdbeAddOp3(p,0x7f,addr2,iVar3,addr1);
      sqlite3VdbeAddOp1(p,0x83,addr1);
      sqlite3VdbeAddOp2(p,0x85,addr1,iVar3);
      sqlite3VdbeChangeP5(p,0x10);
      sqlite3ReleaseTempReg((Parse *)pIndex_local,iVar3);
      sqlite3VdbeAddOp2(p,3,addr2,iPartIdxLabel);
      sqlite3VdbeJumpHere(p,tnum);
      sqlite3VdbeAddOp1(p,0x75,iSorter);
      sqlite3VdbeAddOp1(p,0x75,addr1);
      sqlite3VdbeAddOp1(p,0x75,addr2);
    }
  }
  return;
}

Assistant:

static void sqlite3RefillIndex(Parse *pParse, Index *pIndex, int memRootPage){
  Table *pTab = pIndex->pTable;  /* The table that is indexed */
  int iTab = pParse->nTab++;     /* Btree cursor used for pTab */
  int iIdx = pParse->nTab++;     /* Btree cursor used for pIndex */
  int iSorter;                   /* Cursor opened by OpenSorter (if in use) */
  int addr1;                     /* Address of top of loop */
  int addr2;                     /* Address to jump to for next iteration */
  int tnum;                      /* Root page of index */
  int iPartIdxLabel;             /* Jump to this label to skip a row */
  Vdbe *v;                       /* Generate code into this virtual machine */
  KeyInfo *pKey;                 /* KeyInfo for index */
  int regRecord;                 /* Register holding assembled index record */
  sqlite3 *db = pParse->db;      /* The database connection */
  int iDb = sqlite3SchemaToIndex(db, pIndex->pSchema);

#ifndef SQLITE_OMIT_AUTHORIZATION
  if( sqlite3AuthCheck(pParse, SQLITE_REINDEX, pIndex->zName, 0,
      db->aDb[iDb].zDbSName ) ){
    return;
  }
#endif

  /* Require a write-lock on the table to perform this operation */
  sqlite3TableLock(pParse, iDb, pTab->tnum, 1, pTab->zName);

  v = sqlite3GetVdbe(pParse);
  if( v==0 ) return;
  if( memRootPage>=0 ){
    tnum = memRootPage;
  }else{
    tnum = pIndex->tnum;
  }
  pKey = sqlite3KeyInfoOfIndex(pParse, pIndex);
  assert( pKey!=0 || db->mallocFailed || pParse->nErr );

  /* Open the sorter cursor if we are to use one. */
  iSorter = pParse->nTab++;
  sqlite3VdbeAddOp4(v, OP_SorterOpen, iSorter, 0, pIndex->nKeyCol, (char*)
                    sqlite3KeyInfoRef(pKey), P4_KEYINFO);

  /* Open the table. Loop through all rows of the table, inserting index
  ** records into the sorter. */
  sqlite3OpenTable(pParse, iTab, iDb, pTab, OP_OpenRead);
  addr1 = sqlite3VdbeAddOp2(v, OP_Rewind, iTab, 0); VdbeCoverage(v);
  regRecord = sqlite3GetTempReg(pParse);
  sqlite3MultiWrite(pParse);

  sqlite3GenerateIndexKey(pParse,pIndex,iTab,regRecord,0,&iPartIdxLabel,0,0);
  sqlite3VdbeAddOp2(v, OP_SorterInsert, iSorter, regRecord);
  sqlite3ResolvePartIdxLabel(pParse, iPartIdxLabel);
  sqlite3VdbeAddOp2(v, OP_Next, iTab, addr1+1); VdbeCoverage(v);
  sqlite3VdbeJumpHere(v, addr1);
  if( memRootPage<0 ) sqlite3VdbeAddOp2(v, OP_Clear, tnum, iDb);
  sqlite3VdbeAddOp4(v, OP_OpenWrite, iIdx, tnum, iDb, 
                    (char *)pKey, P4_KEYINFO);
  sqlite3VdbeChangeP5(v, OPFLAG_BULKCSR|((memRootPage>=0)?OPFLAG_P2ISREG:0));

  addr1 = sqlite3VdbeAddOp2(v, OP_SorterSort, iSorter, 0); VdbeCoverage(v);
  if( IsUniqueIndex(pIndex) ){
    int j2 = sqlite3VdbeGoto(v, 1);
    addr2 = sqlite3VdbeCurrentAddr(v);
    sqlite3VdbeVerifyAbortable(v, OE_Abort);
    sqlite3VdbeAddOp4Int(v, OP_SorterCompare, iSorter, j2, regRecord,
                         pIndex->nKeyCol); VdbeCoverage(v);
    sqlite3UniqueConstraint(pParse, OE_Abort, pIndex);
    sqlite3VdbeJumpHere(v, j2);
  }else{
    addr2 = sqlite3VdbeCurrentAddr(v);
  }
  sqlite3VdbeAddOp3(v, OP_SorterData, iSorter, regRecord, iIdx);
  sqlite3VdbeAddOp1(v, OP_SeekEnd, iIdx);
  sqlite3VdbeAddOp2(v, OP_IdxInsert, iIdx, regRecord);
  sqlite3VdbeChangeP5(v, OPFLAG_USESEEKRESULT);
  sqlite3ReleaseTempReg(pParse, regRecord);
  sqlite3VdbeAddOp2(v, OP_SorterNext, iSorter, addr2); VdbeCoverage(v);
  sqlite3VdbeJumpHere(v, addr1);

  sqlite3VdbeAddOp1(v, OP_Close, iTab);
  sqlite3VdbeAddOp1(v, OP_Close, iIdx);
  sqlite3VdbeAddOp1(v, OP_Close, iSorter);
}